

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureImmutableFormatCase::test
          (TextureImmutableFormatCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestLog *pTVar2;
  GLenum GVar3;
  GLsizei GVar4;
  long *plVar5;
  size_type *psVar6;
  ulong uVar7;
  undefined8 uVar8;
  string local_f0;
  ScopedLogSection section;
  TestLog local_c0;
  long lStack_b8;
  string local_b0;
  string local_90;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  GLuint textureID;
  ScopedLogSection subsection;
  code *local_40;
  GLenum local_38;
  
  pTVar2 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Initial","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Initial","");
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,&local_b0,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  StateQueryUtil::verifyStateTextureParamInteger
            (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0,
             (this->super_TextureTest).m_type);
  tcu::TestLog::endSection(section.m_log);
  pTVar2 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Immutable","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Immutable","");
  tcu::ScopedLogSection::ScopedLogSection(&subsection,pTVar2,&local_b0,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  textureID = 0;
  glu::CallLogWrapper::glGenTextures(gl,1,&textureID);
  glu::CallLogWrapper::glBindTexture(gl,(this->super_TextureTest).m_target,textureID);
  GVar3 = glu::CallLogWrapper::glGetError(gl);
  if (GVar3 != 0) {
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Got Error ","");
    local_40 = glu::getErrorName;
    local_38 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_90,&local_40);
    uVar7 = 0xf;
    if (local_70 != local_60) {
      uVar7 = local_60[0];
    }
    if (uVar7 < local_90._M_string_length + local_68) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        uVar8 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_90._M_string_length + local_68) goto LAB_01876e40;
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70)
      ;
    }
    else {
LAB_01876e40:
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
    }
    section.m_log = &local_c0;
    pTVar2 = (TestLog *)(plVar5 + 2);
    if ((TestLog *)*plVar5 == pTVar2) {
      local_c0.m_log = pTVar2->m_log;
      lStack_b8 = plVar5[3];
    }
    else {
      local_c0.m_log = pTVar2->m_log;
      section.m_log = (TestLog *)*plVar5;
    }
    *plVar5 = (long)pTVar2;
    plVar5[1] = 0;
    *(undefined1 *)&pTVar2->m_log = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&section);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_f0.field_2._M_allocated_capacity = *psVar6;
      local_f0.field_2._8_8_ = plVar5[3];
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar6;
      local_f0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_f0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_b0.field_2._M_allocated_capacity = *psVar6;
      local_b0.field_2._8_8_ = plVar5[3];
      local_b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar6;
      local_b0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_b0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(result,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (section.m_log != &local_c0) {
      operator_delete(section.m_log,(ulong)((long)&(local_c0.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  GVar3 = (this->super_TextureTest).m_target;
  GVar4 = 8;
  if ((int)GVar3 < 0x8c1a) {
    if (GVar3 != 0xde1) {
      if (GVar3 == 0x806f) goto LAB_0187705c;
      if (GVar3 != 0x8513) goto LAB_018770ef;
    }
    glu::CallLogWrapper::glTexStorage2D(gl,GVar3,1,0x8058,0x20,0x20);
  }
  else if ((int)GVar3 < 0x9100) {
    if (GVar3 != 0x8c1a) {
      if (GVar3 != 0x9009) goto LAB_018770ef;
      GVar4 = 0xc;
    }
LAB_0187705c:
    glu::CallLogWrapper::glTexStorage3D(gl,GVar3,1,0x8058,0x20,0x20,GVar4);
  }
  else if (GVar3 == 0x9100) {
    glu::CallLogWrapper::glTexStorage2DMultisample(gl,0x9100,2,0x8051,0x40,0x40,'\0');
  }
  else if (GVar3 == 0x9102) {
    glu::CallLogWrapper::glTexStorage3DMultisample(gl,0x9102,2,0x8051,0x40,0x40,2,'\0');
  }
LAB_018770ef:
  GVar3 = glu::CallLogWrapper::glGetError(gl);
  if (GVar3 != 0) {
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Got Error ","");
    local_40 = glu::getErrorName;
    local_38 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_90,&local_40);
    uVar7 = 0xf;
    if (local_70 != local_60) {
      uVar7 = local_60[0];
    }
    if (uVar7 < local_90._M_string_length + local_68) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        uVar8 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_90._M_string_length + local_68) goto LAB_01877192;
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70)
      ;
    }
    else {
LAB_01877192:
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
    }
    section.m_log = &local_c0;
    pTVar2 = (TestLog *)(plVar5 + 2);
    if ((TestLog *)*plVar5 == pTVar2) {
      local_c0.m_log = pTVar2->m_log;
      lStack_b8 = plVar5[3];
    }
    else {
      local_c0.m_log = pTVar2->m_log;
      section.m_log = (TestLog *)*plVar5;
    }
    *plVar5 = (long)pTVar2;
    plVar5[1] = 0;
    *(undefined1 *)&pTVar2->m_log = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&section);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_f0.field_2._M_allocated_capacity = *psVar6;
      local_f0.field_2._8_8_ = plVar5[3];
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar6;
      local_f0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_f0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_b0.field_2._M_allocated_capacity = *psVar6;
      local_b0.field_2._8_8_ = plVar5[3];
      local_b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar6;
      local_b0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_b0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(result,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (section.m_log != &local_c0) {
      operator_delete(section.m_log,(ulong)((long)&(local_c0.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  StateQueryUtil::verifyStateTextureParamInteger
            (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,1,
             (this->super_TextureTest).m_type);
  glu::CallLogWrapper::glDeleteTextures(gl,1,&textureID);
  GVar3 = glu::CallLogWrapper::glGetError(gl);
  if (GVar3 != 0) {
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Got Error ","");
    local_40 = glu::getErrorName;
    local_38 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_90,&local_40);
    uVar7 = 0xf;
    if (local_70 != local_60) {
      uVar7 = local_60[0];
    }
    if (uVar7 < local_90._M_string_length + local_68) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        uVar8 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_90._M_string_length + local_68) goto LAB_0187740f;
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70)
      ;
    }
    else {
LAB_0187740f:
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
    }
    section.m_log = &local_c0;
    pTVar2 = (TestLog *)(plVar5 + 2);
    if ((TestLog *)*plVar5 == pTVar2) {
      local_c0.m_log = pTVar2->m_log;
      lStack_b8 = plVar5[3];
    }
    else {
      local_c0.m_log = pTVar2->m_log;
      section.m_log = (TestLog *)*plVar5;
    }
    *plVar5 = (long)pTVar2;
    plVar5[1] = 0;
    *(undefined1 *)&pTVar2->m_log = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&section);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_f0.field_2._M_allocated_capacity = *psVar6;
      local_f0.field_2._8_8_ = plVar5[3];
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar6;
      local_f0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_f0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_b0.field_2._M_allocated_capacity = *psVar6;
      local_b0.field_2._8_8_ = plVar5[3];
      local_b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar6;
      local_b0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_b0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(result,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (section.m_log != &local_c0) {
      operator_delete(section.m_log,(ulong)((long)&(local_c0.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  tcu::TestLog::endSection(subsection.m_log);
  if (((this->super_TextureTest).m_target | 2) == 0x9102) {
    return;
  }
  pTVar2 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Mutable","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Mutable","");
  tcu::ScopedLogSection::ScopedLogSection(&subsection,pTVar2,&local_b0,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  textureID = 0;
  glu::CallLogWrapper::glGenTextures(gl,1,&textureID);
  glu::CallLogWrapper::glBindTexture(gl,(this->super_TextureTest).m_target,textureID);
  GVar3 = glu::CallLogWrapper::glGetError(gl);
  if (GVar3 != 0) {
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Got Error ","");
    local_40 = glu::getErrorName;
    local_38 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_90,&local_40);
    uVar7 = 0xf;
    if (local_70 != local_60) {
      uVar7 = local_60[0];
    }
    if (uVar7 < local_90._M_string_length + local_68) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        uVar8 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_90._M_string_length + local_68) goto LAB_01877734;
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70)
      ;
    }
    else {
LAB_01877734:
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
    }
    section.m_log = &local_c0;
    pTVar2 = (TestLog *)(plVar5 + 2);
    if ((TestLog *)*plVar5 == pTVar2) {
      local_c0.m_log = pTVar2->m_log;
      lStack_b8 = plVar5[3];
    }
    else {
      local_c0.m_log = pTVar2->m_log;
      section.m_log = (TestLog *)*plVar5;
    }
    *plVar5 = (long)pTVar2;
    plVar5[1] = 0;
    *(undefined1 *)&pTVar2->m_log = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&section);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_f0.field_2._M_allocated_capacity = *psVar6;
      local_f0.field_2._8_8_ = plVar5[3];
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar6;
      local_f0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_f0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_b0.field_2._M_allocated_capacity = *psVar6;
      local_b0.field_2._8_8_ = plVar5[3];
      local_b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar6;
      local_b0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_b0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(result,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (section.m_log != &local_c0) {
      operator_delete(section.m_log,(ulong)((long)&(local_c0.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  GVar3 = (this->super_TextureTest).m_target;
  GVar4 = 8;
  if ((int)GVar3 < 0x8513) {
    if (GVar3 == 0xde1) {
LAB_0187791b:
      glu::CallLogWrapper::glTexImage2D(gl,GVar3,0,0x8058,0x20,0x20,0,0x1908,0x1401,(void *)0x0);
    }
    else if (GVar3 == 0x806f) goto LAB_0187794f;
  }
  else {
    if (GVar3 == 0x9009) {
      GVar4 = 0xc;
    }
    else if (GVar3 != 0x8c1a) {
      if (GVar3 != 0x8513) goto LAB_01877981;
      GVar3 = 0x8518;
      goto LAB_0187791b;
    }
LAB_0187794f:
    glu::CallLogWrapper::glTexImage3D(gl,GVar3,0,0x8058,0x20,0x20,GVar4,0,0x1908,0x1401,(void *)0x0)
    ;
  }
LAB_01877981:
  GVar3 = glu::CallLogWrapper::glGetError(gl);
  if (GVar3 != 0) {
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Got Error ","");
    local_40 = glu::getErrorName;
    local_38 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_90,&local_40);
    uVar7 = 0xf;
    if (local_70 != local_60) {
      uVar7 = local_60[0];
    }
    if (uVar7 < local_90._M_string_length + local_68) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        uVar8 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_90._M_string_length + local_68) goto LAB_01877a24;
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70)
      ;
    }
    else {
LAB_01877a24:
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
    }
    section.m_log = &local_c0;
    pTVar2 = (TestLog *)(plVar5 + 2);
    if ((TestLog *)*plVar5 == pTVar2) {
      local_c0.m_log = pTVar2->m_log;
      lStack_b8 = plVar5[3];
    }
    else {
      local_c0.m_log = pTVar2->m_log;
      section.m_log = (TestLog *)*plVar5;
    }
    *plVar5 = (long)pTVar2;
    plVar5[1] = 0;
    *(undefined1 *)&pTVar2->m_log = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&section);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_f0.field_2._M_allocated_capacity = *psVar6;
      local_f0.field_2._8_8_ = plVar5[3];
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar6;
      local_f0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_f0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_b0.field_2._M_allocated_capacity = *psVar6;
      local_b0.field_2._8_8_ = plVar5[3];
      local_b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar6;
      local_b0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_b0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(result,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (section.m_log != &local_c0) {
      operator_delete(section.m_log,(ulong)((long)&(local_c0.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  StateQueryUtil::verifyStateTextureParamInteger
            (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0,
             (this->super_TextureTest).m_type);
  glu::CallLogWrapper::glDeleteTextures(gl,1,&textureID);
  GVar3 = glu::CallLogWrapper::glGetError(gl);
  if (GVar3 == 0) goto LAB_01877e42;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Got Error ","");
  local_40 = glu::getErrorName;
  local_38 = GVar3;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_90,&local_40);
  uVar7 = 0xf;
  if (local_70 != local_60) {
    uVar7 = local_60[0];
  }
  if (uVar7 < local_90._M_string_length + local_68) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar8 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_90._M_string_length + local_68) goto LAB_01877c9d;
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_01877c9d:
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
  }
  section.m_log = &local_c0;
  pTVar2 = (TestLog *)(plVar5 + 2);
  if ((TestLog *)*plVar5 == pTVar2) {
    local_c0.m_log = pTVar2->m_log;
    lStack_b8 = plVar5[3];
  }
  else {
    local_c0.m_log = pTVar2->m_log;
    section.m_log = (TestLog *)*plVar5;
  }
  *plVar5 = (long)pTVar2;
  plVar5[1] = 0;
  *(undefined1 *)&pTVar2->m_log = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&section);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_f0.field_2._M_allocated_capacity = *psVar6;
    local_f0.field_2._8_8_ = plVar5[3];
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar6;
    local_f0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_f0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_b0.field_2._M_allocated_capacity = *psVar6;
    local_b0.field_2._8_8_ = plVar5[3];
    local_b0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar6;
    local_b0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_b0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  tcu::ResultCollector::fail(result,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (section.m_log != &local_c0) {
    operator_delete(section.m_log,(ulong)((long)&(local_c0.m_log)->flags + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
LAB_01877e42:
  tcu::TestLog::endSection(subsection.m_log);
  return;
}

Assistant:

void TextureImmutableFormatCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, 0, m_type);
	}

	{
		const tcu::ScopedLogSection	subsection	(m_testCtx.getLog(), "Immutable", "Immutable");
		GLuint						textureID	= 0;

		gl.glGenTextures(1, &textureID);
		gl.glBindTexture(m_target, textureID);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindTexture");

		switch (m_target)
		{
			case GL_TEXTURE_2D:
			case GL_TEXTURE_CUBE_MAP:
			{
				gl.glTexStorage2D(m_target, 1, GL_RGBA8, 32, 32);
				break;
			}
			case GL_TEXTURE_2D_ARRAY:
			case GL_TEXTURE_3D:
			{
				gl.glTexStorage3D(m_target, 1, GL_RGBA8, 32, 32, 8);
				break;
			}
			case GL_TEXTURE_2D_MULTISAMPLE:
			{
				gl.glTexStorage2DMultisample(m_target, 2, GL_RGB8, 64, 64, GL_FALSE);
				break;
			}
			case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
			{
				gl.glTexStorage3DMultisample(m_target, 2, GL_RGB8, 64, 64, 2, GL_FALSE);
				break;
			}
			case GL_TEXTURE_CUBE_MAP_ARRAY:
			{
				gl.glTexStorage3D(m_target, 1, GL_RGBA8, 32, 32, 6 * 2);
				break;
			}
			default:
				DE_ASSERT(false);
		}
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "setup texture");

		verifyStateTextureParamInteger(result, gl, m_target, m_pname, 1, m_type);

		gl.glDeleteTextures(1, &textureID);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteTextures");
	}

	// no mutable
	if (m_target == GL_TEXTURE_2D_MULTISAMPLE ||
		m_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
		return;

	// test mutable
	{
		const tcu::ScopedLogSection	subsection		(m_testCtx.getLog(), "Mutable", "Mutable");
		GLuint						textureID		= 0;

		gl.glGenTextures(1, &textureID);
		gl.glBindTexture(m_target, textureID);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindTexture");

		switch (m_target)
		{
			case GL_TEXTURE_2D:
			{
				gl.glTexImage2D(m_target, 0, GL_RGBA8, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
				break;
			}
			case GL_TEXTURE_CUBE_MAP:
			{
				gl.glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, GL_RGBA8, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
				break;
			}
			case GL_TEXTURE_2D_ARRAY:
			case GL_TEXTURE_3D:
			{
				gl.glTexImage3D(m_target, 0, GL_RGBA8, 32, 32, 8, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
				break;
			}
			case GL_TEXTURE_CUBE_MAP_ARRAY:
			{
				gl.glTexImage3D(m_target, 0, GL_RGBA8, 32, 32, 6 * 2, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
				break;
			}
			default:
				DE_ASSERT(false);
		}
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "setup texture");

		verifyStateTextureParamInteger(result, gl, m_target, m_pname, 0, m_type);

		gl.glDeleteTextures(1, &textureID);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteTextures");
	}
}